

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

size_t muduo::detail::convertHex(char *buf,uintptr_t value)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  int lsd;
  char *p;
  uintptr_t i;
  char *local_20;
  
  local_20 = in_RDI;
  pcVar2 = in_RSI;
  do {
    uVar1 = (uint)pcVar2;
    pcVar2 = (char *)((ulong)pcVar2 >> 4);
    pcVar3 = local_20 + 1;
    *local_20 = "0123456789ABCDEF"[(int)(uVar1 & 0xf)];
    local_20 = pcVar3;
  } while (pcVar2 != (char *)0x0);
  *pcVar3 = '\0';
  std::reverse<char*>(in_RSI,(char *)0x0);
  return (long)pcVar3 - (long)in_RDI;
}

Assistant:

size_t convertHex(char buf[], uintptr_t value)
{
  uintptr_t i = value;
  char* p = buf;

  do
  {
    int lsd = static_cast<int>(i % 16);
    i /= 16;
    *p++ = digitsHex[lsd];
  } while (i != 0);

  *p = '\0';
  std::reverse(buf, p);

  return p - buf;
}